

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O2

SampledSpectrum __thiscall
pbrt::ImageInfiniteLight::Le(ImageInfiniteLight *this,Ray *ray,SampledWavelengths *lambda)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Point2f st;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  Vector3<float> VVar3;
  SampledSpectrum SVar4;
  Tuple3<pbrt::Vector3,_float> local_30;
  Tuple3<pbrt::Vector3,_float> local_20;
  
  VVar3 = Transform::ApplyInverse<float>(&(this->super_LightBase).renderFromLight,&ray->d);
  local_30.z = VVar3.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar1._8_8_ = extraout_XMM0_Qb;
  auVar1._0_8_ = VVar3.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_30._0_8_ = vmovlps_avx(auVar1);
  VVar3 = Normalize<float>((Vector3<float> *)&local_30);
  local_20.z = VVar3.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar2._8_8_ = extraout_XMM0_Qb_00;
  auVar2._0_8_ = VVar3.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_20._0_8_ = vmovlps_avx(auVar2);
  st = EqualAreaSphereToSquare((Vector3f *)&local_20);
  SVar4 = LookupLe(this,st,lambda);
  return (array<float,_4>)(array<float,_4>)SVar4;
}

Assistant:

Le(const Ray &ray, const SampledWavelengths &lambda) const {
        Vector3f wl = Normalize(renderFromLight.ApplyInverse(ray.d));
        Point2f st = EqualAreaSphereToSquare(wl);
        return LookupLe(st, lambda);
    }